

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O1

string * __thiscall
gmlc::utilities::stringOps::characterReplace_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view source,char key,
          string_view repStr)

{
  undefined7 in_register_00000081;
  char *in_R9;
  stringOps *psVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(size_type)this);
  if (this != (stringOps *)0x0) {
    psVar1 = (stringOps *)0x0;
    do {
      if (psVar1[source._M_len] == source._M_str._0_1_) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,in_R9,CONCAT71(in_register_00000081,key));
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char)psVar1[source._M_len]);
      }
      psVar1 = psVar1 + 1;
    } while (this != psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string characterReplace(
        std::string_view source,
        char key,
        std::string_view repStr)
    {
        std::string result;
        result.reserve(source.length());
        for (auto sourceChar : source) {
            if (sourceChar == key) {
                result += repStr;
            } else {
                result.push_back(sourceChar);
            }
        }
        return result;
    }